

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnknownHandleManager.cpp
# Opt level: O0

void __thiscall
helics::UnknownHandleManager::clearFederateUnknowns(UnknownHandleManager *this,GlobalFederateId gid)

{
  undefined4 in_ESI;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  *unaff_retaddr;
  anon_class_4_1_ba1d4b22 clearCall;
  undefined4 in_stack_fffffffffffffff8;
  
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearFederateUnknowns(helics::GlobalFederateId)::__0>
            (unaff_retaddr,(anon_class_4_1_ba1d4b22 *)CONCAT44(in_ESI,in_stack_fffffffffffffff8));
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearFederateUnknowns(helics::GlobalFederateId)::__0>
            (unaff_retaddr,(anon_class_4_1_ba1d4b22 *)CONCAT44(in_ESI,in_stack_fffffffffffffff8));
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearFederateUnknowns(helics::GlobalFederateId)::__0>
            (unaff_retaddr,(anon_class_4_1_ba1d4b22 *)CONCAT44(in_ESI,in_stack_fffffffffffffff8));
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearFederateUnknowns(helics::GlobalFederateId)::__0>
            (unaff_retaddr,(anon_class_4_1_ba1d4b22 *)CONCAT44(in_ESI,in_stack_fffffffffffffff8));
  return;
}

Assistant:

void UnknownHandleManager::clearFederateUnknowns(GlobalFederateId gid)
{
    auto clearCall = [gid](const auto& it) { return it.second.first.fed_id == gid; };
    maperase_if(unknown_publications, clearCall);
    maperase_if(unknown_endpoints, clearCall);
    maperase_if(unknown_filters, clearCall);
    maperase_if(unknown_inputs, clearCall);
}